

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,CaseStatement *stmt)

{
  type pSVar1;
  bool bVar2;
  Statement *pSVar3;
  long in_RSI;
  pair<const_slang::ast::Statement_*,_bool> pVar4;
  bool covered;
  Expression *itemExpr;
  iterator __end4;
  iterator __begin4;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range4;
  ItemGroup *item;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *__range3;
  DataFlowState finalState;
  type initialState;
  type_conflict2 *isKnown;
  type *knownBranch;
  CaseStatement *in_stack_000006d0;
  FlowAnalysisBase *in_stack_000006d8;
  DataFlowState *in_stack_fffffffffffffc08;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_fffffffffffffc10;
  undefined7 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1f;
  DataFlowState *in_stack_fffffffffffffc90;
  DataFlowAnalysis *in_stack_fffffffffffffc98;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_fffffffffffffcc0;
  DataFlowState *in_stack_fffffffffffffd30;
  DataFlowState *in_stack_fffffffffffffd38;
  DataFlowAnalysis *in_stack_fffffffffffffd40;
  iterator in_stack_fffffffffffffd98;
  iterator in_stack_fffffffffffffda0;
  EvalContext *in_stack_fffffffffffffe18;
  CaseStatement *in_stack_fffffffffffffe20;
  __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
  local_1a0;
  long local_198;
  type_conflict2 *local_40;
  type *local_38;
  Statement *local_30;
  undefined1 local_28;
  Statement *local_20;
  undefined1 local_18;
  long local_10;
  
  local_10 = in_RSI;
  visit<slang::ast::Expression>(in_stack_fffffffffffffc10,(Expression *)in_stack_fffffffffffffc08);
  pVar4 = ast::CaseStatement::getKnownBranch(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_30 = pVar4.first;
  local_28 = pVar4.second;
  local_20 = local_30;
  local_18 = local_28;
  local_38 = std::get<0ul,slang::ast::Statement_const*,bool>
                       ((pair<const_slang::ast::Statement_*,_bool> *)0x8236ba);
  local_40 = std::get<1ul,slang::ast::Statement_const*,bool>
                       ((pair<const_slang::ast::Statement_*,_bool> *)0x8236cc);
  DataFlowState::DataFlowState((DataFlowState *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08)
  ;
  DataFlowAnalysis::unreachableState
            ((DataFlowAnalysis *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
  local_198 = local_10 + 0x28;
  local_1a0._M_current =
       (ItemGroup *)
       std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *)
                  in_stack_fffffffffffffc08);
  std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::end
            ((span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *)
             CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
  while (bVar2 = __gnu_cxx::
                 operator==<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffc10,
                            (__normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffc08), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
    ::operator*(&local_1a0);
    if (((*local_40 & 1U) == 0) ||
       (pSVar1 = *local_38,
       pSVar3 = not_null::operator_cast_to_Statement_
                          ((not_null<const_slang::ast::Statement_*> *)0x8237a2), pSVar1 == pSVar3))
    {
      DataFlowAnalysis::copyState(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
      setState((AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                *)in_stack_fffffffffffffda0._M_current,
               (DataFlowState *)in_stack_fffffffffffffd98._M_current);
      DataFlowState::~DataFlowState((DataFlowState *)0x823838);
    }
    else {
      setUnreachable(in_stack_fffffffffffffcc0);
    }
    in_stack_fffffffffffffda0 =
         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                    in_stack_fffffffffffffc08);
    in_stack_fffffffffffffd98 =
         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                   ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                    CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
    while (bVar2 = __gnu_cxx::
                   operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffc10,
                              (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffc08), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator*((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                   *)&stack0xfffffffffffffda0);
      visit<slang::ast::Expression>
                (in_stack_fffffffffffffc10,(Expression *)in_stack_fffffffffffffc08);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                    *)&stack0xfffffffffffffda0);
    }
    not_null<const_slang::ast::Statement_*>::operator*
              ((not_null<const_slang::ast::Statement_*> *)0x823905);
    visit<slang::ast::Statement>(in_stack_fffffffffffffc10,(Statement *)in_stack_fffffffffffffc08);
    DataFlowAnalysis::joinState
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
    ::operator++(&local_1a0);
  }
  bVar2 = analysis::FlowAnalysisBase::isFullyCovered(in_stack_000006d8,in_stack_000006d0);
  if (*(long *)(local_10 + 0x38) == 0) {
    if (((*local_40 & 1U) == 0) && (!bVar2)) {
      DataFlowAnalysis::joinState
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    }
  }
  else {
    if ((bVar2) || (((*local_40 & 1U) != 0 && (*local_38 != *(type *)(local_10 + 0x38))))) {
      setUnreachable(in_stack_fffffffffffffcc0);
    }
    else {
      DataFlowAnalysis::copyState(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
      setState((AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                *)in_stack_fffffffffffffda0._M_current,
               (DataFlowState *)in_stack_fffffffffffffd98._M_current);
      DataFlowState::~DataFlowState((DataFlowState *)0x823a02);
    }
    visit<slang::ast::Statement>(in_stack_fffffffffffffc10,(Statement *)in_stack_fffffffffffffc08);
    DataFlowAnalysis::joinState
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  }
  DataFlowState::DataFlowState((DataFlowState *)&stack0xfffffffffffffc48,in_stack_fffffffffffffc08);
  setState((AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
            *)in_stack_fffffffffffffda0._M_current,
           (DataFlowState *)in_stack_fffffffffffffd98._M_current);
  DataFlowState::~DataFlowState((DataFlowState *)0x823acb);
  DataFlowState::~DataFlowState((DataFlowState *)0x823ad8);
  DataFlowState::~DataFlowState((DataFlowState *)0x823ae5);
  return;
}

Assistant:

void visitStmt(const CaseStatement& stmt) {
        visit(stmt.expr);

        // If the branch is known we can visit it explicitly,
        // otherwise we need to merge states for all case items.
        // TODO: report warnings from the eval here?
        auto [knownBranch, isKnown] = stmt.getKnownBranch(evalContext);

        auto initialState = std::move(state);
        auto finalState = (DERIVED).unreachableState();

        for (auto& item : stmt.items) {
            if (isKnown && knownBranch != item.stmt)
                setUnreachable();
            else
                setState((DERIVED).copyState(initialState));

            for (auto itemExpr : item.expressions)
                visit(*itemExpr);

            visit(*item.stmt);
            (DERIVED).joinState(finalState, state);
        }

        // Determine whether the case statement has full coverage of all possible
        // inputs, such that we're guaranteed to select one of the case items.
        const bool covered = isFullyCovered(stmt);

        if (stmt.defaultCase) {
            // If the case input is fully covered by item expressions,
            // or if we have a statically known branch that is not the
            // default, then we know the default case is never hit.
            if (covered || (isKnown && knownBranch != stmt.defaultCase))
                setUnreachable();
            else
                setState((DERIVED).copyState(initialState));

            visit(*stmt.defaultCase);
            (DERIVED).joinState(finalState, state);
        }
        else if (!isKnown && !covered) {
            // Branch is not statically known and the case input is
            // not fully covered, so we have to assume that no item
            // may be selected and that the initial state is relevant.
            (DERIVED).joinState(finalState, initialState);
        }

        setState(std::move(finalState));
    }